

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::emit_action(Action *action,OutputFile *o,uint32_t ind,bool *readCh,State *s,
                      string *condName,Skeleton *skeleton,
                      set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
                      *used_labels,bool save_yyaccept)

{
  OutputFile *this;
  opt_t *poVar1;
  string local_60;
  undefined1 local_39;
  string *psStack_38;
  bool save_yyaccept_local;
  string *condName_local;
  State *s_local;
  bool *readCh_local;
  OutputFile *pOStack_18;
  uint32_t ind_local;
  OutputFile *o_local;
  Action *action_local;
  
  local_39 = save_yyaccept;
  psStack_38 = condName;
  condName_local = (string *)s;
  s_local = (State *)readCh;
  readCh_local._4_4_ = ind;
  pOStack_18 = o;
  o_local = (OutputFile *)action;
  switch(action->type) {
  case MATCH:
    emit_match(o,ind,readCh,s);
    break;
  case INITIAL:
    emit_initial(o,ind,readCh,s,(action->info).initial,used_labels);
    break;
  case SAVE:
    emit_save(o,ind,readCh,s,(action->info).save,save_yyaccept);
    break;
  case MOVE:
    break;
  case ACCEPT:
    emit_accept(o,ind,readCh,s,(action->info).accepts);
    break;
  case RULE:
    emit_rule(o,ind,s,(action->info).rule,condName,skeleton);
  }
  if ((((byte)condName_local[1]._M_dataplus & 1) != 0) &&
     (poVar1 = Opt::operator->((Opt *)&opts), this = pOStack_18, poVar1->target != DOT)) {
    poVar1 = Opt::operator->((Opt *)&opts);
    InputAPI::stmt_backupctx_abi_cxx11_(&local_60,&poVar1->input_api,readCh_local._4_4_);
    OutputFile::wstring(this,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void emit_action
	( const Action & action
	, OutputFile & o
	, uint32_t ind
	, bool & readCh
	, const State * const s
	, const std::string & condName
	, const Skeleton * skeleton
	, const std::set<label_t> & used_labels
	, bool save_yyaccept
	)
{
	switch (action.type)
	{
		case Action::MATCH:
			emit_match (o, ind, readCh, s);
			break;
		case Action::INITIAL:
			emit_initial (o, ind, readCh, s, * action.info.initial, used_labels);
			break;
		case Action::SAVE:
			emit_save (o, ind, readCh, s, action.info.save, save_yyaccept);
			break;
		case Action::MOVE:
			break;
		case Action::ACCEPT:
			emit_accept (o, ind, readCh, s, * action.info.accepts);
			break;
		case Action::RULE:
			emit_rule (o, ind, s, action.info.rule, condName, skeleton);
			break;
	}
	if (s->isPreCtxt && opts->target != opt_t::DOT)
	{
		o.wstring(opts->input_api.stmt_backupctx (ind));
	}
}